

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c++
# Opt level: O0

void kj::_::throwDestroyedWhileInList(void)

{
  char (*in_RCX) [45];
  String local_1b0;
  Exception local_198;
  
  Debug::makeDescription<char_const(&)[45]>
            (&local_1b0,(Debug *)"\"destroyed object that is still in a kj::List\"",
             "destroyed object that is still in a kj::List",in_RCX);
  Exception::Exception
            (&local_198,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list.c++"
             ,0x2a,&local_1b0);
  throwFatalException(&local_198,0);
}

Assistant:

void throwDestroyedWhileInList() {
  kj::throwFatalException(KJ_EXCEPTION(FAILED,
      "destroyed object that is still in a kj::List"));
}